

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubDLevel::ClearComponentDamagedState
          (ON_SubDLevel *this,bool bClearVerticesDamagedState,bool bClearEdgesDamagedState,
          bool bClearFacesDamagedState)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  ON_SubDVertex *pOVar3;
  uint uVar4;
  ON_SubDEdge *pOVar5;
  ON_SubDFace *pOVar6;
  bool bVar7;
  
  uVar2 = 0;
  if ((((int)CONCAT71(in_register_00000031,bClearVerticesDamagedState) != 0) &&
      (pOVar3 = this->m_vertex[0], uVar2 = 0, pOVar3 != (ON_SubDVertex *)0x0)) &&
     (this->m_vertex_count != 0)) {
    uVar2 = 0;
    uVar4 = 1;
    do {
      uVar1 = ON_ComponentStatus::SetDamagedState
                        (&(pOVar3->super_ON_SubDComponentBase).m_status,false);
      uVar2 = (uVar2 + 1) - (uint)(uVar1 == 0);
      pOVar3 = pOVar3->m_next_vertex;
      if (pOVar3 == (ON_SubDVertex *)0x0) break;
      bVar7 = uVar4 < this->m_vertex_count;
      uVar4 = uVar4 + 1;
    } while (bVar7);
  }
  if (((bClearEdgesDamagedState) && (pOVar5 = this->m_edge[0], pOVar5 != (ON_SubDEdge *)0x0)) &&
     (this->m_edge_count != 0)) {
    uVar4 = 1;
    do {
      uVar1 = ON_ComponentStatus::SetDamagedState
                        (&(pOVar5->super_ON_SubDComponentBase).m_status,false);
      uVar2 = (uVar2 + 1) - (uint)(uVar1 == 0);
      pOVar5 = pOVar5->m_next_edge;
      if (pOVar5 == (ON_SubDEdge *)0x0) break;
      bVar7 = uVar4 < this->m_edge_count;
      uVar4 = uVar4 + 1;
    } while (bVar7);
  }
  if (((bClearFacesDamagedState) && (pOVar6 = this->m_face[0], pOVar6 != (ON_SubDFace *)0x0)) &&
     (this->m_face_count != 0)) {
    uVar4 = 1;
    do {
      uVar1 = ON_ComponentStatus::SetDamagedState
                        (&(pOVar6->super_ON_SubDComponentBase).m_status,false);
      uVar2 = (uVar2 + 1) - (uint)(uVar1 == 0);
      pOVar6 = pOVar6->m_next_face;
      if (pOVar6 == (ON_SubDFace *)0x0) {
        return uVar2;
      }
      bVar7 = uVar4 < this->m_face_count;
      uVar4 = uVar4 + 1;
    } while (bVar7);
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDLevel::ClearComponentDamagedState(
  bool bClearVerticesDamagedState,
  bool bClearEdgesDamagedState,
  bool bClearFacesDamagedState
) const
{
  unsigned int change_count = 0;
  unsigned int i;
  if (bClearVerticesDamagedState)
  {
    i = 0;
    for (const ON_SubDVertex* v = m_vertex[0]; nullptr != v && i++ < m_vertex_count; v = v->m_next_vertex)
      if (0 != v->m_status.SetDamagedState(false))
        ++change_count;
  }
  if (bClearEdgesDamagedState)
  {
    i = 0;
    for (const ON_SubDEdge* e = m_edge[0]; nullptr != e && i++ < m_edge_count; e = e->m_next_edge)
      if (0 != e->m_status.SetDamagedState(false))
        ++change_count;
  }
  if (bClearFacesDamagedState)
  {
    i = 0;
    for (const ON_SubDFace* f = m_face[0]; nullptr != f && i++ < m_face_count; f = f->m_next_face)
      if (0 != f->m_status.SetDamagedState(false))
        ++change_count;
  }
  return change_count;
}